

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<std::__cxx11::string,char[29],std::__cxx11::string,char[91]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char (*args_1) [29],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   char (*args_3) [91])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  size_t local_78;
  char *pcStack_70;
  size_type local_68;
  pointer local_60;
  size_t local_58;
  char (*local_50) [29];
  size_type local_48;
  pointer local_40;
  size_t local_38;
  char (*local_30) [91];
  
  local_88._M_len = (a->View_)._M_len;
  local_88._M_str = (a->View_)._M_str;
  local_78 = (b->View_)._M_len;
  pcStack_70 = (b->View_)._M_str;
  local_60 = (args->_M_dataplus)._M_p;
  local_68 = args->_M_string_length;
  local_58 = strlen(*args_1);
  local_40 = (args_2->_M_dataplus)._M_p;
  local_48 = args_2->_M_string_length;
  local_50 = args_1;
  local_38 = strlen(*args_3);
  local_30 = args_3;
  views._M_len = 6;
  views._M_array = &local_88;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}